

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::state_base::partial_advance(state_base *this,lzdecision *lzdec)

{
  uint uVar1;
  int iVar2;
  int *in_RSI;
  int *in_RDI;
  int dist_1;
  int dist;
  int match_hist_index;
  
  if (in_RSI[1] == 0) {
    if ((uint)in_RDI[1] < 4) {
      in_RDI[1] = 0;
    }
    else if ((uint)in_RDI[1] < 10) {
      in_RDI[1] = in_RDI[1] + -3;
    }
    else {
      in_RDI[1] = in_RDI[1] + -6;
    }
  }
  else if (in_RSI[2] < 0) {
    iVar2 = in_RSI[2];
    if (iVar2 == -1) {
      if (in_RSI[1] == 1) {
        iVar2 = 0xb;
        if ((uint)in_RDI[1] < 7) {
          iVar2 = 9;
        }
        in_RDI[1] = iVar2;
      }
      else {
        iVar2 = 0xb;
        if ((uint)in_RDI[1] < 7) {
          iVar2 = 8;
        }
        in_RDI[1] = iVar2;
      }
    }
    else {
      if (iVar2 == -2) {
        std::swap<unsigned_int>((uint *)(in_RDI + 2),(uint *)(in_RDI + 3));
      }
      else if (iVar2 == -3) {
        iVar2 = in_RDI[4];
        in_RDI[4] = in_RDI[3];
        in_RDI[3] = in_RDI[2];
        in_RDI[2] = iVar2;
      }
      else {
        iVar2 = in_RDI[5];
        in_RDI[5] = in_RDI[4];
        in_RDI[4] = in_RDI[3];
        in_RDI[3] = in_RDI[2];
        in_RDI[2] = iVar2;
      }
      iVar2 = 0xb;
      if ((uint)in_RDI[1] < 7) {
        iVar2 = 8;
      }
      in_RDI[1] = iVar2;
    }
  }
  else {
    in_RDI[5] = in_RDI[4];
    in_RDI[4] = in_RDI[3];
    in_RDI[3] = in_RDI[2];
    in_RDI[2] = in_RSI[2];
    iVar2 = 10;
    if ((uint)in_RDI[1] < 7) {
      iVar2 = 7;
    }
    in_RDI[1] = iVar2;
  }
  iVar2 = *in_RSI;
  uVar1 = lzdecision::get_len((lzdecision *)0x1111b8);
  *in_RDI = iVar2 + uVar1;
  return;
}

Assistant:

void lzcompressor::state_base::partial_advance(const lzdecision& lzdec)
   {
      if (lzdec.m_len == 0)
      {
         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         if (lzdec.m_dist < 0)
         {
            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               if (lzdec.m_len == 1)
               {
                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               if (match_hist_index == 1)
               {
                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else if (match_hist_index == 2)
               {
                  int dist = m_match_hist[2];
                  m_match_hist[2] = m_match_hist[1];
                  m_match_hist[1] = m_match_hist[0];
                  m_match_hist[0] = dist;
               }
               else
               {
                  LZHAM_ASSERT(match_hist_index == 3);

                  int dist = m_match_hist[3];
                  m_match_hist[3] = m_match_hist[2];
                  m_match_hist[2] = m_match_hist[1];
                  m_match_hist[1] = m_match_hist[0];
                  m_match_hist[0] = dist;
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            // full
            LZHAM_ASSUME(CLZBase::cMatchHistSize == 4);
            m_match_hist[3] = m_match_hist[2];
            m_match_hist[2] = m_match_hist[1];
            m_match_hist[1] = m_match_hist[0];
            m_match_hist[0] = lzdec.m_dist;

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
   }